

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table_test.cc
# Opt level: O1

void __thiscall
StackTraceTableTestHelper::CheckTracesAndReset
          (StackTraceTableTestHelper *this,uintptr_t *expected,int len)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *message;
  long lVar1;
  AssertHelper local_58;
  void *local_50;
  unique_ptr<void_*[],_std::default_delete<void_*[]>_> entries;
  AssertionResult gtest_ar;
  
  tcmalloc::ProduceStackTracesDump
            ((tcmalloc *)&local_50,DumpTraces::anon_class_1_0_00000001::__invoke,
             (this->head_)._M_t.
             super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
             ._M_t.
             super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
             .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl);
  std::
  __uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::reset((__uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
           *)this,(pointer)0x0);
  if (0 < len) {
    lVar1 = 0;
    this_00 = &gtest_ar.message_;
    do {
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           *(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             *)&((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)local_50 + lVar1))->_M_t;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&entries,"reinterpret_cast<uintptr_t>(entries[i])","expected[i]",
                 (unsigned_long *)this_00,(unsigned_long *)((long)expected + lVar1));
      if ((char)entries._M_t.super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
                super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
                super__Head_base<0UL,_void_**,_false>._M_head_impl == '\0') {
        testing::Message::Message((Message *)this_00);
        message = "";
        if (gtest_ar._0_8_ != 0) {
          message = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/stack_trace_table_test.cc"
                   ,0x33,message);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)this_00);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          (**(code **)(*(long *)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))();
        }
      }
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
      lVar1 = lVar1 + 8;
    } while ((ulong)(uint)len << 3 != lVar1);
  }
  if (local_50 != (void *)0x0) {
    operator_delete__(local_50);
  }
  return;
}

Assistant:

void CheckTracesAndReset(const uintptr_t* expected, int len) {
    std::unique_ptr<void*[]> entries = DumpTraces();
    for (int i = 0; i < len; i++) {
      EXPECT_EQ(reinterpret_cast<uintptr_t>(entries[i]), expected[i]);
    }
  }